

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

OneStepDelaySyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::OneStepDelaySyntax,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1)

{
  Token hash;
  Token oneStep;
  OneStepDelaySyntax *this_00;
  Token *args_local_1;
  Token *args_local;
  BumpAllocator *this_local;
  
  this_00 = (OneStepDelaySyntax *)allocate(this,0x30,8);
  hash.kind = args->kind;
  hash._2_1_ = args->field_0x2;
  hash.numFlags.raw = (args->numFlags).raw;
  hash.rawLen = args->rawLen;
  hash.info = args->info;
  oneStep.kind = args_1->kind;
  oneStep._2_1_ = args_1->field_0x2;
  oneStep.numFlags.raw = (args_1->numFlags).raw;
  oneStep.rawLen = args_1->rawLen;
  oneStep.info = args_1->info;
  slang::syntax::OneStepDelaySyntax::OneStepDelaySyntax(this_00,hash,oneStep);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }